

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

Node * __thiscall rw::ColorQuant::getNode(ColorQuant *this,Node *root,uint32 addr,int32 level)

{
  Node *pNVar1;
  int level_00;
  uint uVar2;
  
  for (level_00 = level + -1; level_00 != -1; level_00 = level_00 + -1) {
    uVar2 = addr & 0xf;
    pNVar1 = root->children[uVar2];
    if (pNVar1 == (Node *)0x0) {
      pNVar1 = createNode(this,level_00);
      root->children[uVar2] = pNVar1;
      pNVar1->parent = root;
      pNVar1 = root->children[uVar2];
    }
    addr = addr >> 4;
    root = pNVar1;
  }
  return root;
}

Assistant:

ColorQuant::Node*
ColorQuant::getNode(ColorQuant::Node *root, uint32 addr, int32 level)
{
	if(level == 0)
		return root;

	uint32 a = addr & 0xF;
	if(root->children[a] == nil){
		root->children[a] = this->createNode(level-1);
		root->children[a]->parent = root;
	}

	return this->getNode(root->children[a], addr>>4, level-1);
}